

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O3

void __thiscall
JobManagerTestSuite_StartCancel_Test::TestBody(JobManagerTestSuite_StartCancel_Test *this)

{
  FunctionMocker<void_()> *pFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  MatcherDescriberInterface *pMVar4;
  element_type *peVar5;
  byte bVar6;
  int iVar7;
  CommissionerAppMock *pCVar8;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar9;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar10;
  TypedExpectation<void_()> *pTVar11;
  undefined8 uVar12;
  pointer ppJVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  MatcherDescriberInterface MVar17;
  _func_int **message;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<unsigned_long> __l_01;
  Status local_91a;
  Status local_919;
  _Any_data local_918;
  undefined1 local_908 [20];
  NetworkId nid;
  _Any_data local_8f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0;
  BorderRouterId rid;
  _Any_data local_8c8;
  undefined1 local_8b8 [8];
  code *pcStack_8b0;
  CommissionerAppMockPtr commissionerAppMocks [3];
  BorderRouterId local_86c;
  bool wasThreadRunning;
  undefined7 uStack_867;
  undefined8 uStack_860;
  undefined1 local_858 [16];
  internal local_848 [8];
  MatcherDescriberInterface *local_840;
  bool shouldStop;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_830;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  ByteArray local_818;
  ByteArray local_7f8;
  string local_7d8;
  string local_7b8;
  _func_int **local_798;
  element_type *local_790;
  State local_784;
  Channel local_780;
  State local_77c;
  undefined1 local_778 [16];
  undefined1 local_768 [8];
  undefined1 local_760 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_750;
  _Alloc_hider local_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_730 [20];
  element_type *local_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  undefined1 local_5c8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5b0;
  JobManagerTestSuite_StartCancel_Test *local_468;
  Error local_460;
  UnixTime local_438;
  UnixTime local_430;
  UnixTime local_428;
  Error local_420;
  TestContext ctx;
  
  JobManagerTestSuite::TestContext::TestContext(&ctx);
  local_468 = this;
  JobManagerTestSuite::SetInitialExpectations(&this->super_JobManagerTestSuite,&ctx);
  local_778._0_2_ = 0x3031;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ctx.mConf.mPSKc);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&nid);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&rid);
  peVar5 = ctx.mPS.
           super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_8f0,0);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_8c8,0);
  local_5e0._0_8_ = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"pan1","");
  commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(commissionerAppMocks + 1);
  MVar17._vptr_MatcherDescriberInterface = (_func_int **)0x26a8b5;
  local_5e8 = commissionerAppMocks[0].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"","");
  ot::commissioner::persistent_storage::Network::Network
            ((Network *)local_778,(NetworkId *)&local_8f0,(DomainId *)&local_8c8,(string *)local_5e0
             ,1,1,1,(string *)commissionerAppMocks,0);
  iVar7 = (*(peVar5->super_PersistentStorage)._vptr_PersistentStorage[6])(peVar5,local_778,&nid);
  wasThreadRunning = (bool)(char)iVar7;
  _shouldStop = _shouldStop & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&local_918,"ctx.mPS->Add(Network{0, 0, \"pan1\", 1, 1, 0x1, \"\", 0}, nid)"
             ,"PersistentStorage::Status::kSuccess",&wasThreadRunning,&shouldStop);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_p != local_730) {
    operator_delete(local_740._M_p);
  }
  if ((undefined1 *)local_778._8_8_ != local_760) {
    operator_delete((void *)local_778._8_8_);
  }
  if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)(commissionerAppMocks + 1)) {
    operator_delete(commissionerAppMocks[0].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((undefined1 *)local_5e0._0_8_ != local_5d0) {
    operator_delete((void *)local_5e0._0_8_);
  }
  uVar12 = local_918._8_8_;
  if ((internal)local_918._M_pod_data[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_778);
    if ((MatcherDescriberInterface *)local_918._8_8_ != (MatcherDescriberInterface *)0x0) {
      MVar17._vptr_MatcherDescriberInterface = *(_func_int ***)local_918._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_5e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
               ,0xfc,(char *)MVar17._vptr_MatcherDescriberInterface);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_5e0,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined **)local_778._0_8_ + 8))();
    }
    uVar12 = local_918._8_8_;
    if ((MatcherDescriberInterface *)local_918._8_8_ == (MatcherDescriberInterface *)0x0)
    goto LAB_0012917c;
    if (*(_func_int ***)local_918._8_8_ != (_func_int **)(local_918._8_8_ + 0x10)) {
      operator_delete(*(_func_int ***)local_918._8_8_);
    }
  }
  else {
    if ((MatcherDescriberInterface *)local_918._8_8_ != (MatcherDescriberInterface *)0x0) {
      if ((MatcherDescriberInterface *)*(_func_int ***)local_918._8_8_ !=
          (MatcherDescriberInterface *)(local_918._8_8_ + 0x10)) {
        operator_delete(*(_func_int ***)local_918._8_8_);
      }
      operator_delete((void *)uVar12);
    }
    local_5e0._0_8_ = local_5e0._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)local_778,"nid.mId","0",&nid.mId,(int *)local_5e0);
    if ((internal)local_778[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((pointer)local_778._8_8_ == (pointer)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_778._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0xfd,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)commissionerAppMocks,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    uVar12 = local_778._8_8_;
    if ((pointer)local_778._8_8_ != (pointer)0x0) {
      if (*(pointer *)local_778._8_8_ != (pointer)(local_778._8_8_ + 0x10)) {
        operator_delete(*(pointer *)local_778._8_8_);
      }
      operator_delete((void *)uVar12);
    }
    peVar5 = ctx.mPS.
             super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_86c,0);
    commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(commissionerAppMocks + 1);
    std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"127.0.0.1","");
    local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_918._M_unused._M_object = local_908;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_77c,0,0,0,0,0);
    local_8f0._M_unused._M_object = &local_8e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"");
    local_8c8._M_unused._M_object = local_8b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"");
    _wasThreadRunning = local_858;
    std::__cxx11::string::_M_construct<char_const*>((string *)&wasThreadRunning,"");
    _shouldStop = (pointer)&local_828;
    std::__cxx11::string::_M_construct<char_const*>((string *)&shouldStop,"");
    local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"");
    local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
    message = (_func_int **)0x26a8b5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"","");
    ot::commissioner::UnixTime::UnixTime(&local_428,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)local_5e0,(string *)commissionerAppMocks,0x4e21,&local_7f8,
               (string *)&local_918,local_77c,(string *)&local_8f0,0,(string *)&local_8c8,
               (string *)&wasThreadRunning,(Timestamp)0x0,0,(string *)&shouldStop,&local_818,
               &local_7d8,'\0',0,&local_7b8,local_428,0xf);
    ot::commissioner::persistent_storage::BorderRouter::BorderRouter
              ((BorderRouter *)local_778,&local_86c,&nid,(BorderAgent *)local_5e0);
    iVar7 = (*(peVar5->super_PersistentStorage)._vptr_PersistentStorage[7])(peVar5,local_778,&rid);
    local_919 = (Status)iVar7;
    local_91a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
              (local_848,
               "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
               ,"PersistentStorage::Status::kSuccess",&local_919,&local_91a);
    local_778._0_8_ = &PTR__BorderRouter_002dacd8;
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_768);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_5e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
      operator_delete(local_7b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p);
    }
    if (local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_shouldStop != &local_828) {
      operator_delete(_shouldStop);
    }
    if ((undefined1 *)_wasThreadRunning != local_858) {
      operator_delete((void *)_wasThreadRunning);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_8c8._M_unused._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_8b8) {
      operator_delete(local_8c8._M_unused._M_object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0._M_unused._0_8_ != &local_8e0) {
      operator_delete(local_8f0._M_unused._M_object);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_918._M_unused._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_908) {
      operator_delete(local_918._M_unused._M_object);
    }
    if (local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)(commissionerAppMocks + 1)) {
      operator_delete(commissionerAppMocks[0].
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    pMVar4 = local_840;
    if (local_848[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_778);
      if (local_840 != (MatcherDescriberInterface *)0x0) {
        message = local_840->_vptr_MatcherDescriberInterface;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_5e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x104,(char *)message);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_5e0,(Message *)local_778);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_778._0_8_ !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(undefined **)local_778._0_8_ + 8))();
      }
      if (local_840 == (MatcherDescriberInterface *)0x0) goto LAB_0012917c;
      uVar12 = local_840;
      if ((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface != local_840 + 2)
      {
        operator_delete((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface);
      }
    }
    else {
      if (local_840 != (MatcherDescriberInterface *)0x0) {
        if ((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface != local_840 + 2
           ) {
          operator_delete((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface);
        }
        operator_delete(pMVar4);
      }
      local_5e0._0_8_ = local_5e0._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_778,"rid.mId","0",&rid.mId,(int *)local_5e0);
      if ((internal)local_778[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_5e0);
        if ((pointer)local_778._8_8_ == (pointer)0x0) {
          pcVar15 = "";
        }
        else {
          pcVar15 = *(char **)local_778._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x105,pcVar15);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)commissionerAppMocks,(Message *)local_5e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
        if ((long *)local_5e0._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_5e0._0_8_ + 8))();
        }
      }
      uVar12 = local_778._8_8_;
      if ((pointer)local_778._8_8_ != (pointer)0x0) {
        if (*(pointer *)local_778._8_8_ != (pointer)(local_778._8_8_ + 0x10)) {
          operator_delete(*(pointer *)local_778._8_8_);
        }
        operator_delete((void *)uVar12);
      }
      peVar5 = ctx.mPS.
               super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_8f0,0);
      ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_8c8,0);
      local_5e0._0_8_ = local_5d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"pan2","");
      commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(commissionerAppMocks + 1);
      MVar17._vptr_MatcherDescriberInterface = (_func_int **)0x26a8b5;
      std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"","");
      ot::commissioner::persistent_storage::Network::Network
                ((Network *)local_778,(NetworkId *)&local_8f0,(DomainId *)&local_8c8,
                 (string *)local_5e0,2,2,2,(string *)commissionerAppMocks,0);
      iVar7 = (*(peVar5->super_PersistentStorage)._vptr_PersistentStorage[6])(peVar5,local_778,&nid)
      ;
      wasThreadRunning = (bool)(char)iVar7;
      _shouldStop = _shouldStop & 0xffffffffffffff00;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                ((internal *)&local_918,
                 "ctx.mPS->Add(Network{0, 0, \"pan2\", 2, 2, 0x2, \"\", 0}, nid)",
                 "PersistentStorage::Status::kSuccess",&wasThreadRunning,&shouldStop);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_740._M_p != local_730) {
        operator_delete(local_740._M_p);
      }
      if ((undefined1 *)local_778._8_8_ != local_760) {
        operator_delete((void *)local_778._8_8_);
      }
      if (commissionerAppMocks[0].
          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)(commissionerAppMocks + 1)) {
        operator_delete(commissionerAppMocks[0].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((undefined1 *)local_5e0._0_8_ != local_5d0) {
        operator_delete((void *)local_5e0._0_8_);
      }
      uVar12 = local_918._8_8_;
      if ((internal)local_918._M_pod_data[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_778);
        if ((MatcherDescriberInterface *)local_918._8_8_ != (MatcherDescriberInterface *)0x0) {
          MVar17._vptr_MatcherDescriberInterface = *(_func_int ***)local_918._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_5e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x107,(char *)MVar17._vptr_MatcherDescriberInterface);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_5e0,(Message *)local_778);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_778._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(undefined **)local_778._0_8_ + 8))();
        }
        uVar12 = local_918._8_8_;
        if ((MatcherDescriberInterface *)local_918._8_8_ == (MatcherDescriberInterface *)0x0)
        goto LAB_0012917c;
        if ((MatcherDescriberInterface *)*(_func_int ***)local_918._8_8_ !=
            (MatcherDescriberInterface *)(local_918._8_8_ + 0x10)) {
          operator_delete(*(_func_int ***)local_918._8_8_);
        }
      }
      else {
        if ((MatcherDescriberInterface *)local_918._8_8_ != (MatcherDescriberInterface *)0x0) {
          if ((MatcherDescriberInterface *)*(_func_int ***)local_918._8_8_ !=
              (MatcherDescriberInterface *)(local_918._8_8_ + 0x10)) {
            operator_delete(*(_func_int ***)local_918._8_8_);
          }
          operator_delete((void *)uVar12);
        }
        local_5e0._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)local_778,"nid.mId","1",&nid.mId,(int *)local_5e0);
        if ((internal)local_778[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_5e0);
          if ((pointer)local_778._8_8_ == (pointer)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_778._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x108,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)commissionerAppMocks,(Message *)local_5e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
          if ((long *)local_5e0._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_5e0._0_8_ + 8))();
          }
        }
        uVar12 = local_778._8_8_;
        if ((pointer)local_778._8_8_ != (pointer)0x0) {
          if (*(pointer *)local_778._8_8_ != (pointer)(local_778._8_8_ + 0x10)) {
            operator_delete(*(pointer *)local_778._8_8_);
          }
          operator_delete((void *)uVar12);
        }
        local_790 = ctx.mPS.
                    super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_86c,0);
        commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(commissionerAppMocks + 1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)commissionerAppMocks,"127.0.0.1","");
        local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_918._M_unused._M_object = local_908;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"1.1","");
        ot::commissioner::BorderAgent::State::State((State *)&local_780,0,0,0,0,0);
        local_8f0._M_unused._M_object = &local_8e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"");
        local_8c8._M_unused._M_object = local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"");
        _wasThreadRunning = local_858;
        std::__cxx11::string::_M_construct<char_const*>((string *)&wasThreadRunning,"");
        _shouldStop = (pointer)&local_828;
        std::__cxx11::string::_M_construct<char_const*>((string *)&shouldStop,"");
        local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"");
        local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
        local_798 = (_func_int **)0x26a8b5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8);
        ot::commissioner::UnixTime::UnixTime(&local_430,0);
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)local_5e0,(string *)commissionerAppMocks,0x4e22,&local_7f8,
                   (string *)&local_918,(State)local_780,(string *)&local_8f0,0,(string *)&local_8c8
                   ,(string *)&wasThreadRunning,(Timestamp)0x0,0,(string *)&shouldStop,&local_818,
                   &local_7d8,'\0',0,&local_7b8,local_430,0xf);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                  ((BorderRouter *)local_778,&local_86c,&nid,(BorderAgent *)local_5e0);
        iVar7 = (*(local_790->super_PersistentStorage)._vptr_PersistentStorage[7])
                          (local_790,local_778,&rid);
        local_919 = (Status)iVar7;
        local_91a = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                  (local_848,
                   "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                   ,"PersistentStorage::Status::kSuccess",&local_919,&local_91a);
        local_778._0_8_ = &PTR__BorderRouter_002dacd8;
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_768);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_5e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
          operator_delete(local_7b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p);
        }
        if (local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_818.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_shouldStop != &local_828) {
          operator_delete(_shouldStop);
        }
        if ((undefined1 *)_wasThreadRunning != local_858) {
          operator_delete((void *)_wasThreadRunning);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_8c8._M_unused._0_8_ !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_8b8) {
          operator_delete(local_8c8._M_unused._M_object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f0._M_unused._0_8_ != &local_8e0) {
          operator_delete(local_8f0._M_unused._M_object);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_918._M_unused._0_8_ !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_908) {
          operator_delete(local_918._M_unused._M_object);
        }
        if (local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_7f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)(commissionerAppMocks + 1)) {
          operator_delete(commissionerAppMocks[0].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         );
        }
        pMVar4 = local_840;
        if (local_848[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_778);
          if (local_840 != (MatcherDescriberInterface *)0x0) {
            local_798 = local_840->_vptr_MatcherDescriberInterface;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_5e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x10f,(char *)local_798);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_5e0,(Message *)local_778)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_778._0_8_ !=
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            (**(code **)(*(undefined **)local_778._0_8_ + 8))();
          }
          if (local_840 == (MatcherDescriberInterface *)0x0) goto LAB_0012917c;
          uVar12 = local_840;
          if ((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface !=
              local_840 + 2) {
            operator_delete((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface)
            ;
          }
        }
        else {
          if (local_840 != (MatcherDescriberInterface *)0x0) {
            if ((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface !=
                local_840 + 2) {
              operator_delete((MatcherDescriberInterface *)
                              local_840->_vptr_MatcherDescriberInterface);
            }
            operator_delete(pMVar4);
          }
          local_5e0._0_4_ = 1;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)local_778,"rid.mId","1",&rid.mId,(int *)local_5e0);
          if ((internal)local_778[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_5e0);
            if ((pointer)local_778._8_8_ == (pointer)0x0) {
              pcVar15 = "";
            }
            else {
              pcVar15 = *(char **)local_778._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x110,pcVar15);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)commissionerAppMocks,(Message *)local_5e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
            if ((long *)local_5e0._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_5e0._0_8_ + 8))();
            }
          }
          uVar12 = local_778._8_8_;
          if ((pointer)local_778._8_8_ != (pointer)0x0) {
            if (*(pointer *)local_778._8_8_ != (pointer)(local_778._8_8_ + 0x10)) {
              operator_delete(*(pointer *)local_778._8_8_);
            }
            operator_delete((void *)uVar12);
          }
          peVar5 = ctx.mPS.
                   super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_8f0,0);
          ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_8c8,0);
          local_5e0._0_8_ = local_5d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"pan3","");
          commissionerAppMocks[0].
          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(commissionerAppMocks + 1);
          MVar17._vptr_MatcherDescriberInterface = (_func_int **)0x26a8b5;
          std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"","");
          ot::commissioner::persistent_storage::Network::Network
                    ((Network *)local_778,(NetworkId *)&local_8f0,(DomainId *)&local_8c8,
                     (string *)local_5e0,3,3,3,(string *)commissionerAppMocks,0);
          iVar7 = (*(peVar5->super_PersistentStorage)._vptr_PersistentStorage[6])
                            (peVar5,local_778,&nid);
          wasThreadRunning = (bool)(char)iVar7;
          _shouldStop = _shouldStop & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                    ((internal *)&local_918,
                     "ctx.mPS->Add(Network{0, 0, \"pan3\", 3, 3, 0x3, \"\", 0}, nid)",
                     "PersistentStorage::Status::kSuccess",&wasThreadRunning,&shouldStop);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_p != local_730) {
            operator_delete(local_740._M_p);
          }
          if ((undefined1 *)local_778._8_8_ != local_760) {
            operator_delete((void *)local_778._8_8_);
          }
          if (commissionerAppMocks[0].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)(commissionerAppMocks + 1)) {
            operator_delete(commissionerAppMocks[0].
                            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
          }
          if ((undefined1 *)local_5e0._0_8_ != local_5d0) {
            operator_delete((void *)local_5e0._0_8_);
          }
          uVar12 = local_918._8_8_;
          if ((internal)local_918._M_pod_data[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_778);
            if ((MatcherDescriberInterface *)local_918._8_8_ != (MatcherDescriberInterface *)0x0) {
              MVar17._vptr_MatcherDescriberInterface = *(_func_int ***)local_918._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_5e0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x112,(char *)MVar17._vptr_MatcherDescriberInterface);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_5e0,(Message *)local_778);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
            if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_778._0_8_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(undefined **)local_778._0_8_ + 8))();
            }
            uVar12 = local_918._8_8_;
            if ((MatcherDescriberInterface *)local_918._8_8_ == (MatcherDescriberInterface *)0x0)
            goto LAB_0012917c;
            if ((MatcherDescriberInterface *)*(_func_int ***)local_918._8_8_ !=
                (MatcherDescriberInterface *)(local_918._8_8_ + 0x10)) {
              operator_delete(*(_func_int ***)local_918._8_8_);
            }
          }
          else {
            if ((MatcherDescriberInterface *)local_918._8_8_ != (MatcherDescriberInterface *)0x0) {
              if ((MatcherDescriberInterface *)*(_func_int ***)local_918._8_8_ !=
                  (MatcherDescriberInterface *)(local_918._8_8_ + 0x10)) {
                operator_delete(*(_func_int ***)local_918._8_8_);
              }
              operator_delete((void *)uVar12);
            }
            local_5e0._0_4_ = 2;
            testing::internal::CmpHelperEQ<unsigned_int,int>
                      ((internal *)local_778,"nid.mId","2",&nid.mId,(int *)local_5e0);
            if ((internal)local_778[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_5e0);
              if ((pointer)local_778._8_8_ == (pointer)0x0) {
                pcVar15 = "";
              }
              else {
                pcVar15 = *(char **)local_778._8_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x113,pcVar15);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)commissionerAppMocks,(Message *)local_5e0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
              if ((long *)local_5e0._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_5e0._0_8_ + 8))();
              }
            }
            uVar12 = local_778._8_8_;
            if ((pointer)local_778._8_8_ != (pointer)0x0) {
              if (*(pointer *)local_778._8_8_ != (pointer)(local_778._8_8_ + 0x10)) {
                operator_delete(*(pointer *)local_778._8_8_);
              }
              operator_delete((void *)uVar12);
            }
            local_790 = ctx.mPS.
                        super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
            ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_86c,0);
            commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)(commissionerAppMocks + 1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)commissionerAppMocks,"127.0.0.1","");
            local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_918._M_unused._M_object = local_908;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"1.1","");
            ot::commissioner::BorderAgent::State::State(&local_784,0,0,0,0,0);
            local_8f0._M_unused._M_object = &local_8e0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"");
            local_8c8._M_unused._M_object = local_8b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"");
            _wasThreadRunning = local_858;
            std::__cxx11::string::_M_construct<char_const*>((string *)&wasThreadRunning,"");
            _shouldStop = (pointer)&local_828;
            std::__cxx11::string::_M_construct<char_const*>((string *)&shouldStop,"");
            local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"");
            local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
            local_798 = (_func_int **)0x26a8b5;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8);
            ot::commissioner::UnixTime::UnixTime(&local_438,0);
            pcVar15 = (char *)(ulong)(uint)local_784;
            ot::commissioner::BorderAgent::BorderAgent
                      ((BorderAgent *)local_5e0,(string *)commissionerAppMocks,0x4e23,&local_7f8,
                       (string *)&local_918,local_784,(string *)&local_8f0,0,(string *)&local_8c8,
                       (string *)&wasThreadRunning,(Timestamp)0x0,0,(string *)&shouldStop,&local_818
                       ,&local_7d8,'\0',0,&local_7b8,local_438,0xf);
            ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                      ((BorderRouter *)local_778,&local_86c,&nid,(BorderAgent *)local_5e0);
            iVar7 = (*(local_790->super_PersistentStorage)._vptr_PersistentStorage[7])
                              (local_790,local_778,&rid);
            local_919 = (Status)iVar7;
            local_91a = kSuccess;
            testing::internal::
            CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                      (local_848,
                       "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                       ,"PersistentStorage::Status::kSuccess",&local_919,&local_91a);
            local_778._0_8_ = &PTR__BorderRouter_002dacd8;
            ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_768);
            ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
              operator_delete(local_7b8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
              operator_delete(local_7d8._M_dataplus._M_p);
            }
            if (local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_818.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_shouldStop != &local_828) {
              operator_delete(_shouldStop);
            }
            if ((undefined1 *)_wasThreadRunning != local_858) {
              operator_delete((void *)_wasThreadRunning);
            }
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_8c8._M_unused._0_8_ !=
                (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_8b8) {
              operator_delete(local_8c8._M_unused._M_object);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8f0._M_unused._0_8_ != &local_8e0) {
              operator_delete(local_8f0._M_unused._M_object);
            }
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_918._M_unused._0_8_ !=
                (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_908) {
              operator_delete(local_918._M_unused._M_object);
            }
            if (local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_7f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)(commissionerAppMocks + 1)) {
              operator_delete(commissionerAppMocks[0].
                              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
            }
            if (local_848[0] != (internal)0x0) {
              if (local_840 != (MatcherDescriberInterface *)0x0) {
                if ((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface !=
                    local_840 + 2) {
                  operator_delete((MatcherDescriberInterface *)
                                  local_840->_vptr_MatcherDescriberInterface);
                }
                operator_delete(local_840);
              }
              local_5e0._0_4_ = 2;
              testing::internal::CmpHelperEQ<unsigned_int,int>
                        ((internal *)local_778,"rid.mId","2",&rid.mId,(int *)local_5e0);
              if ((internal)local_778[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_5e0);
                if ((pointer)local_778._8_8_ == (pointer)0x0) {
                  pcVar16 = "";
                }
                else {
                  pcVar16 = *(char **)local_778._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x11b,pcVar16);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)commissionerAppMocks,(Message *)local_5e0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks)
                ;
                if ((long *)local_5e0._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_5e0._0_8_ + 8))();
                }
              }
              uVar12 = local_778._8_8_;
              if ((pointer)local_778._8_8_ != (pointer)0x0) {
                if (*(pointer *)local_778._8_8_ != (pointer)(local_778._8_8_ + 0x10)) {
                  operator_delete(*(pointer *)local_778._8_8_);
                }
                operator_delete((void *)uVar12);
              }
              local_778._0_8_ = local_768;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_778,".","");
              JobManagerTestSuite::Init
                        (&local_468->super_JobManagerTestSuite,&ctx,(string *)local_778);
              if ((undefined1 *)local_778._0_8_ != local_768) {
                operator_delete((void *)local_778._0_8_);
              }
              local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_818.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              pCVar8 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar8,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar8);
              commissionerAppMocks[0].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                        (&commissionerAppMocks[0].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,pCVar8);
              pCVar8 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar8,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar8);
              commissionerAppMocks[1].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                        (&commissionerAppMocks[1].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,pCVar8);
              local_5e8 = (element_type *)(commissionerAppMocks + 2);
              pCVar8 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar8,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar8);
              commissionerAppMocks[2].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                        (&commissionerAppMocks[2].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,pCVar8);
              local_7d8._M_string_length = (size_type)operator_new(8);
              (((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
               local_7d8._M_string_length)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dd928;
              local_7d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002daa30;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_7d8.field_2._M_allocated_capacity,
                         (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                         local_7d8._M_string_length);
              local_7d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002da9e8;
              local_7b8._M_string_length = (size_type)operator_new(8);
              (((MatcherInterface<const_ot::commissioner::Config_&> *)local_7b8._M_string_length)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dd9f0;
              local_7b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002daa98;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_7b8.field_2._M_allocated_capacity,
                         (MatcherInterface<const_ot::commissioner::Config_&> *)
                         local_7b8._M_string_length);
              local_7b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002daa50;
              CommissionerAppStaticExpecter::gmock_Create
                        ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)local_5e0,&ctx.mCommissionerAppStaticExpecter,
                         (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_7d8
                         ,(Matcher<const_ot::commissioner::Config_&> *)&local_7b8);
              testing::internal::GetWithoutMatchers();
              pTVar9 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::InternalExpectedAt
                                 ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                   *)local_5e0,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x124,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
              pTVar9 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::Times(pTVar9,3);
              paVar2 = &local_420.mMessage.field_2;
              local_420.mCode = kNone;
              local_420.mMessage._M_string_length = 0;
              local_420.mMessage.field_2._M_local_buf[0] = '\0';
              local_420.mMessage._M_dataplus._M_p = (pointer)paVar2;
              testing::Return<ot::commissioner::Error>((testing *)&local_7f8,&local_420);
              _shouldStop = (pointer)local_7f8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
              local_830 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_7f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)
                   ((long)local_7f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_7f8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)
                   ((long)local_7f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_7f8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                }
              }
              local_918._M_unused._M_object = commissionerAppMocks;
              local_918._8_8_ = &local_818;
              local_908._0_8_ =
                   std::
                   _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:295:30)>
                   ::_M_manager;
              local_908._8_8_ =
                   std::
                   _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:295:30)>
                   ::_M_invoke;
              local_828._M_allocated_capacity = (size_type)local_918._M_unused._M_object;
              local_828._8_8_ = local_918._8_8_;
              std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                        ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                         &local_8f0,
                         (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                         &local_918);
              local_8b8 = (undefined1  [8])0x0;
              pcStack_8b0 = (code *)0x0;
              local_8c8._M_unused._M_object = (pointer)0x0;
              local_8c8._8_8_ = 0;
              local_8c8._M_unused._M_object = operator_new(0x20);
              *(undefined8 *)local_8c8._M_unused._0_8_ = 0;
              *(undefined8 *)((long)local_8c8._M_unused._0_8_ + 8) = 0;
              *(undefined8 *)((long)local_8c8._M_unused._0_8_ + 0x10) = 0;
              *(undefined8 *)((long)local_8c8._M_unused._0_8_ + 0x18) = local_8e0._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8e0._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                *(undefined4 *)local_8c8._M_unused._0_8_ = local_8f0._0_4_;
                *(undefined4 *)((long)local_8c8._M_unused._0_8_ + 4) = local_8f0._4_4_;
                *(undefined4 *)((long)local_8c8._M_unused._0_8_ + 8) = local_8f0._8_4_;
                *(undefined4 *)((long)local_8c8._M_unused._0_8_ + 0xc) = local_8f0._12_4_;
                *(size_type *)((long)local_8c8._M_unused._0_8_ + 0x10) =
                     local_8e0._M_allocated_capacity;
              }
              local_8c8._8_8_ = 0;
              local_8b8 = (undefined1  [8])std::_Function_handler::operator_cast_to_Action;
              pcStack_8b0 = std::_Function_handler::operator_cast_to_Action;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                (*(code *)local_908._0_8_)(&local_918,&local_918,3);
              }
              __l._M_len = 1;
              __l._M_array = (iterator)&local_8c8;
              std::
              vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
              ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                        *)local_778,__l,(allocator_type *)&local_918);
              if (local_8b8 != (undefined1  [8])0x0) {
                (*(code *)local_8b8)(&local_8c8,&local_8c8,3);
              }
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)local_760,(ReturnAction *)&shouldStop);
              local_858._0_8_ = 0;
              local_858._8_8_ = 0;
              _wasThreadRunning = (pointer)0x0;
              uStack_860 = 0;
              _wasThreadRunning = operator_new(0x38);
              ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)_wasThreadRunning)->
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )local_778._0_8_;
              ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(_wasThreadRunning + 8))->
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )local_778._8_8_;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(_wasThreadRunning + 0x10))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      )local_768;
              local_768 = (undefined1  [8])0x0;
              local_778._0_8_ =
                   (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )0x0;
              local_778._8_8_ = (undefined **)0x0;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(_wasThreadRunning + 0x28))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(_wasThreadRunning + 0x18))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(_wasThreadRunning + 0x20))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(_wasThreadRunning + 0x30))->
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )local_750._8_8_;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_750._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(_wasThreadRunning + 0x18))->
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_760._0_8_;
                ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(_wasThreadRunning + 0x20))->
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_760._8_8_;
                ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(_wasThreadRunning + 0x28))->
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_750._M_allocated_capacity;
                local_750._M_allocated_capacity = 0;
                local_750._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              uStack_860 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_858._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_858._8_8_ = std::_Function_handler::operator_cast_to_Action;
              std::
              vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
              ::~vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                         *)local_778);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::WillRepeatedly(pTVar9,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                       *)&wasThreadRunning);
              if ((code *)local_858._0_8_ != (code *)0x0) {
                (*(code *)local_858._0_8_)(&wasThreadRunning,&wasThreadRunning,3);
              }
              if (local_830 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_830);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_7f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_7f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_420.mMessage._M_dataplus._M_p != paVar2) {
                operator_delete(local_420.mMessage._M_dataplus._M_p);
              }
              local_5c8._8_8_ = &PTR__MatcherBase_002daa30;
              if (local_5b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5b0._M_pi);
              }
              local_5e0._8_8_ = &PTR__MatcherBase_002daa98;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._0_8_);
              }
              local_7b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002daa98;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_7b8.field_2._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_7b8.field_2._M_allocated_capacity);
              }
              local_7d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002daa30;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_7d8.field_2._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_7d8.field_2._M_allocated_capacity);
              }
              local_5e0._0_8_ = local_5d0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"start","");
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)local_5e0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_918,__l_00,(allocator_type *)&local_7d8);
              local_8c8._M_unused._M_member_pointer = 1;
              local_8c8._8_8_ = (MatcherInterface<const_unsigned_short_&> *)0x2;
              local_8b8 = (undefined1  [8])0x3;
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)&local_8c8;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_8f0,__l_01,
                         (allocator_type *)&local_7b8);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)local_778,&ctx.mJobManager,(Expression *)&local_918,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_8f0,false);
              _shouldStop = _shouldStop & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)&wasThreadRunning,
                         "ctx.mJobManager.PrepareJobs({\"start\"}, {0x1, 0x2, 0x3}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)local_778,(ErrorCode *)&shouldStop);
              if ((undefined1 *)local_778._8_8_ != local_760) {
                operator_delete((void *)local_778._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8f0._M_unused._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_8f0._M_unused._M_object);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_918);
              if ((undefined1 *)local_5e0._0_8_ != local_5d0) {
                operator_delete((void *)local_5e0._0_8_);
              }
              if (wasThreadRunning == false) {
                testing::Message::Message((Message *)local_778);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_860 ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pcVar16 = "";
                }
                else {
                  pcVar16 = *(char **)uStack_860;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_5e0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x12a,pcVar16);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_5e0,(Message *)local_778);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
                if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )local_778._0_8_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_778._0_8_ + 8))();
                }
              }
              uVar12 = uStack_860;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_860 !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)uStack_860 !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uStack_860 + 0x10)) {
                  operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)uStack_860);
                }
                operator_delete((void *)uVar12);
              }
              local_5e0._0_4_ = 3;
              testing::internal::CmpHelperEQ<unsigned_char,int>
                        ((internal *)local_778,"camIdx","3",(uchar *)&local_818,(int *)local_5e0);
              if ((internal)local_778[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_5e0);
                if ((undefined **)local_778._8_8_ == (undefined **)0x0) {
                  pcVar16 = "";
                }
                else {
                  pcVar16 = *(char **)local_778._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_918,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,299,pcVar16);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_918,(Message *)local_5e0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_918);
                if ((long *)local_5e0._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_5e0._0_8_ + 8))();
                }
              }
              uVar12 = local_778._8_8_;
              if ((undefined **)local_778._8_8_ != (undefined **)0x0) {
                if (*(undefined ***)local_778._8_8_ != (undefined **)(local_778._8_8_ + 0x10)) {
                  operator_delete(*(undefined ***)local_778._8_8_);
                }
                operator_delete((void *)uVar12);
              }
              local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_818.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              bVar6 = 0;
              do {
                pCVar8 = commissionerAppMocks[bVar6].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_918._8_8_ = operator_new(8);
                (((ByteArray *)local_918._8_8_)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)&PTR__MatcherDescriberInterface_002ddca8
                ;
                local_918._M_unused._M_object = &PTR__MatcherBase_002db840;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_908,
                           (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            *)local_918._8_8_);
                local_918._M_unused._M_object = &PTR__MatcherBase_002db7f8;
                local_8f0._8_8_ = operator_new(8);
                (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   *)local_8f0._8_8_)->super_MatcherDescriberInterface).
                _vptr_MatcherDescriberInterface =
                     (_func_int **)&PTR__MatcherDescriberInterface_002ddd60;
                local_8f0._M_unused._M_object = &PTR__MatcherBase_002db2e8;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &local_8e0._M_allocated_capacity,
                           (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            *)local_8f0._8_8_);
                local_8f0._M_unused._M_object = &PTR__MatcherBase_002db2a0;
                local_8c8._8_8_ = operator_new(8);
                (((MatcherInterface<const_unsigned_short_&> *)local_8c8._8_8_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                     (_func_int **)&PTR__MatcherDescriberInterface_002dde18;
                local_8c8._M_unused._M_object = &PTR__MatcherBase_002db4b0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_8b8,
                           (MatcherInterface<const_unsigned_short_&> *)local_8c8._8_8_);
                local_8c8._M_unused._M_object = &PTR__MatcherBase_002db468;
                CommissionerAppMock::gmock_Start
                          ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                            *)local_778,pCVar8,
                           (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            *)&local_918,
                           (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            *)&local_8f0,(Matcher<unsigned_short> *)&local_8c8);
                testing::internal::GetWithoutMatchers();
                pTVar10 = testing::internal::
                          MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          ::InternalExpectedAt
                                    ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                      *)local_778,
                                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                     ,0x12f,"*commissionerAppMocks[camIdx]","Start(_, _, _)");
                local_460.mCode = kNone;
                local_460.mMessage._M_dataplus._M_p = (pointer)&local_460.mMessage.field_2;
                local_460.mMessage._M_string_length = 0;
                local_460.mMessage.field_2._M_local_buf[0] = '\0';
                testing::Return<ot::commissioner::Error>((testing *)&wasThreadRunning,&local_460);
                testing::internal::ReturnAction::operator_cast_to_Action
                          ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                            *)local_5e0,(ReturnAction *)&wasThreadRunning);
                testing::internal::
                TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                ::WillOnce(pTVar10,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                    *)local_5e0);
                if (local_5d0 != (undefined1  [8])0x0) {
                  (*(code *)local_5d0)
                            ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                              *)local_5e0,
                             (Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                              *)local_5e0,3);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_860 !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_860);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_460.mMessage._M_dataplus._M_p != &local_460.mMessage.field_2) {
                  operator_delete(local_460.mMessage._M_dataplus._M_p);
                }
                local_740._M_p = (pointer)&PTR__MatcherBase_002db840;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_730[0]._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_730[0]._0_8_);
                }
                local_760._8_8_ = &PTR__MatcherBase_002db2e8;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_750._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_750._8_8_);
                }
                local_778._8_8_ = &PTR__MatcherBase_002db4b0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_760._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_760._0_8_);
                }
                local_8c8._M_unused._M_object = &PTR__MatcherBase_002db4b0;
                if (local_8b8 != (undefined1  [8])0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8b8);
                }
                local_8f0._M_unused._M_object = &PTR__MatcherBase_002db2e8;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8e0._M_allocated_capacity
                    != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_8e0._M_allocated_capacity);
                }
                local_918._M_unused._M_object = &PTR__MatcherBase_002db840;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908._0_8_);
                }
                peVar3 = commissionerAppMocks
                         [(ulong)local_818.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start & 0xff].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                pFVar1 = &peVar3->gmock00_CancelRequests_80;
                testing::internal::UntypedFunctionMockerBase::RegisterOwner
                          (&pFVar1->super_UntypedFunctionMockerBase,peVar3);
                local_778._0_8_ = pFVar1;
                testing::internal::GetWithoutMatchers();
                pTVar11 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                                    ((MockSpec<void_()> *)local_778,
                                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                     ,0x130,"*commissionerAppMocks[camIdx]","CancelRequests()");
                testing::internal::TypedExpectation<void_()>::Times(pTVar11,1);
                peVar3 = commissionerAppMocks[2].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                bVar6 = (char)local_818.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1;
                local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(local_818.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar6);
              } while (bVar6 < 2);
              _wasThreadRunning = _wasThreadRunning & 0xffffffffffffff00;
              _shouldStop = _shouldStop & 0xffffffffffffff00;
              local_918._8_8_ = operator_new(8);
              ((MatcherDescriberInterface *)local_918._8_8_)->_vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002ddca8;
              local_918._M_unused._M_object = &PTR__MatcherBase_002db840;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_908,
                         (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)local_918._8_8_);
              local_918._M_unused._M_object = &PTR__MatcherBase_002db7f8;
              local_8f0._8_8_ = operator_new(8);
              (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)local_8f0._8_8_)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002ddd60;
              local_8f0._M_unused._M_object = &PTR__MatcherBase_002db2e8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_8e0._M_allocated_capacity,
                         (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)local_8f0._8_8_);
              local_8f0._M_unused._M_object = &PTR__MatcherBase_002db2a0;
              local_8c8._8_8_ = operator_new(8);
              (((MatcherInterface<const_unsigned_short_&> *)local_8c8._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dde18;
              local_8c8._M_unused._M_object = &PTR__MatcherBase_002db4b0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_8b8,
                         (MatcherInterface<const_unsigned_short_&> *)local_8c8._8_8_);
              local_8c8._M_unused._M_object = &PTR__MatcherBase_002db468;
              CommissionerAppMock::gmock_Start
                        ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)local_778,peVar3,
                         (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&local_918,
                         (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&local_8f0,(Matcher<unsigned_short> *)&local_8c8);
              testing::internal::GetWithoutMatchers();
              pTVar10 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                    *)local_778,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x134,"*commissionerAppMocks[2]","Start(_, _, _)");
              pTVar10 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::Times(pTVar10,1);
              local_5d0 = (undefined1  [8])
                          std::
                          _Function_handler<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short),_testing::Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>::IgnoreArgs<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:308:84)>_>
                          ::_M_manager;
              local_5c8._0_8_ =
                   std::
                   _Function_handler<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short),_testing::Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>::IgnoreArgs<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:308:84)>_>
                   ::_M_invoke;
              local_5e0._0_8_ = &wasThreadRunning;
              local_5e0._8_8_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shouldStop;
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar10,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                  *)local_5e0);
              if (local_5d0 != (undefined1  [8])0x0) {
                (*(code *)local_5d0)(local_5e0,local_5e0,3);
              }
              local_740._M_p = (pointer)&PTR__MatcherBase_002db840;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_730[0]._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_730[0]._0_8_);
              }
              local_760._8_8_ = &PTR__MatcherBase_002db2e8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_750._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_750._8_8_);
              }
              local_778._8_8_ = &PTR__MatcherBase_002db4b0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_760._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_760._0_8_);
              }
              local_8c8._M_unused._M_object = &PTR__MatcherBase_002db4b0;
              if (local_8b8 != (undefined1  [8])0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8b8);
              }
              local_8f0._M_unused._M_object = &PTR__MatcherBase_002db2e8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8e0._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_8e0._M_allocated_capacity);
              }
              local_918._M_unused._M_object = &PTR__MatcherBase_002db840;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908._0_8_);
              }
              pFVar1 = &(commissionerAppMocks[2].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->gmock00_CancelRequests_80;
              testing::internal::UntypedFunctionMockerBase::RegisterOwner
                        (&pFVar1->super_UntypedFunctionMockerBase,
                         commissionerAppMocks[2].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
              local_5e0._0_8_ = pFVar1;
              testing::internal::GetWithoutMatchers();
              pTVar11 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                                  ((MockSpec<void_()> *)local_5e0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x13b,"*commissionerAppMocks[2]","CancelRequests()");
              pTVar11 = testing::internal::TypedExpectation<void_()>::Times(pTVar11,1);
              local_778._8_8_ = (pointer)0x0;
              local_768 = (undefined1  [8])
                          std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:315:86)>
                          ::_M_manager;
              local_760._0_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:315:86)>
                   ::_M_invoke;
              local_778._0_8_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shouldStop;
              testing::internal::TypedExpectation<void_()>::WillOnce
                        (pTVar11,(Action<void_()> *)local_778);
              ppJVar13 = ctx.mJobManager.mJobPool.
                         super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              if (local_768 != (undefined1  [8])0x0) {
                (*(code *)local_768)(local_778,local_778,3);
                ppJVar13 = ctx.mJobManager.mJobPool.
                           super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              }
              for (; ppJVar13 !=
                     ctx.mJobManager.mJobPool.
                     super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish; ppJVar13 = ppJVar13 + 1) {
                ot::commissioner::Job::Run(*ppJVar13);
              }
              local_5e0._0_8_ = CONCAT71(local_5e0._1_7_,shouldStop) ^ 1;
              local_5e0._8_8_ = (pointer)0x0;
              if (shouldStop != false) {
                testing::Message::Message((Message *)&local_918);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_778,(internal *)local_5e0,(AssertionResult *)"shouldStop"
                           ,"true","false",pcVar15);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_8f0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x141,(char *)local_778._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_8f0,(Message *)&local_918);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8f0);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_778._0_8_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_768) {
                  operator_delete((void *)local_778._0_8_);
                }
                if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_918._M_unused._0_8_ !=
                    (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  (**(code **)&(*local_918._M_unused._M_object)->_M_use_count)();
                }
                uVar12 = local_5e0._8_8_;
                if ((pointer)local_5e0._8_8_ != (pointer)0x0) {
                  if (*(pointer *)local_5e0._8_8_ != (pointer)(local_5e0._8_8_ + 0x10)) {
                    operator_delete(*(pointer *)local_5e0._8_8_);
                  }
                  operator_delete((void *)uVar12);
                }
              }
              ot::commissioner::JobManager::CancelCommand(&ctx.mJobManager);
              local_5e0[0] = wasThreadRunning;
              local_5e0._8_8_ = (pointer)0x0;
              if (wasThreadRunning == false) {
                testing::Message::Message((Message *)&local_918);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_778,(internal *)local_5e0,
                           (AssertionResult *)"wasThreadRunning","false","true",pcVar15);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_8f0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x144,(char *)local_778._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_8f0,(Message *)&local_918);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8f0);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_778._0_8_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_768) {
                  operator_delete((void *)local_778._0_8_);
                }
                if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_918._M_unused._0_8_ !=
                    (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  (**(code **)&(*local_918._M_unused._M_object)->_M_use_count)();
                }
                uVar12 = local_5e0._8_8_;
                if ((pointer)local_5e0._8_8_ != (pointer)0x0) {
                  if (*(pointer *)local_5e0._8_8_ != (pointer)(local_5e0._8_8_ + 0x10)) {
                    operator_delete(*(pointer *)local_5e0._8_8_);
                  }
                  operator_delete((void *)uVar12);
                }
              }
              local_5e0[0] = shouldStop;
              local_5e0._8_8_ = (pointer)0x0;
              if (shouldStop == false) {
                testing::Message::Message((Message *)&local_918);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_778,(internal *)local_5e0,(AssertionResult *)"shouldStop"
                           ,"false","true",pcVar15);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_8f0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x145,(char *)local_778._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_8f0,(Message *)&local_918);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8f0);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_778._0_8_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_768) {
                  operator_delete((void *)local_778._0_8_);
                }
                if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_918._M_unused._0_8_ !=
                    (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  (**(code **)&(*local_918._M_unused._M_object)->_M_use_count)();
                }
                uVar12 = local_5e0._8_8_;
                if ((pointer)local_5e0._8_8_ != (pointer)0x0) {
                  if (*(pointer *)local_5e0._8_8_ != (pointer)(local_5e0._8_8_ + 0x10)) {
                    operator_delete(*(pointer *)local_5e0._8_8_);
                  }
                  operator_delete((void *)uVar12);
                }
              }
              lVar14 = 0x30;
              do {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           ((long)&commissionerAppMocks[-1].
                                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + lVar14);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
                lVar14 = lVar14 + -0x10;
              } while (lVar14 != 0);
              goto LAB_0012917c;
            }
            testing::Message::Message((Message *)local_778);
            if (local_840 != (MatcherDescriberInterface *)0x0) {
              local_798 = local_840->_vptr_MatcherDescriberInterface;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_5e0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x11a,(char *)local_798);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_5e0,(Message *)local_778);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
            if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_778._0_8_ !=
                (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0) {
              (**(code **)(*(undefined **)local_778._0_8_ + 8))();
            }
            if (local_840 == (MatcherDescriberInterface *)0x0) goto LAB_0012917c;
            uVar12 = local_840;
            if ((MatcherDescriberInterface *)local_840->_vptr_MatcherDescriberInterface !=
                local_840 + 2) {
              operator_delete((MatcherDescriberInterface *)
                              local_840->_vptr_MatcherDescriberInterface);
            }
          }
        }
      }
    }
  }
  operator_delete((void *)uVar12);
LAB_0012917c:
  JobManagerTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, StartCancel)
{
    TestContext ctx;
    SetInitialExpectations(ctx);

    // Formally set default PSKc
    ctx.mConf.mPSKc = {'1', '0'};

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(3)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    EXPECT_EQ(camIdx, 3);

    for (camIdx = 0; camIdx < 2; ++camIdx)
    {
        EXPECT_CALL(*commissionerAppMocks[camIdx], Start(_, _, _)).WillOnce(Return(Error{}));
        EXPECT_CALL(*commissionerAppMocks[camIdx], CancelRequests()).Times(1);
    }
    volatile bool wasThreadRunning = false;
    volatile bool shouldStop       = false;
    EXPECT_CALL(*commissionerAppMocks[2], Start(_, _, _)).Times(1).WillOnce(Invoke([&]() {
        wasThreadRunning = true;
        while (!shouldStop)
        {
        };
        return Error{};
    }));
    EXPECT_CALL(*commissionerAppMocks[2], CancelRequests()).Times(1).WillOnce(Invoke([&]() { shouldStop = true; }));

    for (auto job : ctx.mJobManager.mJobPool)
    {
        job->Run();
    }
    EXPECT_FALSE(shouldStop);

    ctx.mJobManager.CancelCommand();
    EXPECT_TRUE(wasThreadRunning);
    EXPECT_TRUE(shouldStop);
}